

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

void pnga_set_property(Integer g_a,char *property)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long proc;
  long bytes;
  Integer IVar4;
  Integer *pIVar5;
  logical lVar6;
  long lVar7;
  C_Integer *pCVar8;
  char *in_RSI;
  long in_RDI;
  Integer b;
  Integer ddim;
  int p;
  Integer pcut;
  Integer nblock;
  char *buf;
  Integer *map;
  Integer *pmap [7];
  Integer ld [7];
  Integer hi [7];
  Integer lo [7];
  Integer chunk [7];
  Integer pe [7];
  Integer dims [7];
  Integer blk [7];
  Integer *list;
  Integer me_local;
  Integer g_tmp;
  Integer grp_me;
  Integer status;
  Integer mem_size;
  Integer nelem;
  Integer maplen;
  Integer handle;
  Integer dflt_grp;
  Integer origin_id;
  Integer nodeid;
  Integer nprocs;
  int chk;
  int btot;
  int ndim;
  int d;
  int i;
  Integer ga_handle;
  undefined4 in_stack_fffffffffffffcc8;
  int in_stack_fffffffffffffccc;
  long *in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd8;
  int in_stack_fffffffffffffcdc;
  Integer *in_stack_fffffffffffffce0;
  char **in_stack_fffffffffffffce8;
  char **in_stack_fffffffffffffcf0;
  long local_308;
  long local_300;
  long in_stack_fffffffffffffd10;
  long *in_stack_fffffffffffffd18;
  Integer *in_stack_fffffffffffffd20;
  char **in_stack_fffffffffffffd30;
  char *in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd44;
  int iVar9;
  Integer *in_stack_fffffffffffffd48;
  long in_stack_fffffffffffffd50;
  char *in_stack_fffffffffffffd58;
  Integer in_stack_fffffffffffffd60;
  Integer *in_stack_fffffffffffffd68;
  Integer in_stack_fffffffffffffd70;
  long local_258 [8];
  long local_218 [8];
  long local_1d8 [8];
  long in_stack_fffffffffffffe68;
  char *in_stack_fffffffffffffe70;
  Integer *in_stack_fffffffffffffe80;
  void *in_stack_fffffffffffffe88;
  Integer *in_stack_fffffffffffffe90;
  Integer *in_stack_fffffffffffffe98;
  Integer in_stack_fffffffffffffea0;
  long local_158 [8];
  C_Integer local_118 [8];
  C_Integer local_d8 [8];
  void *local_98;
  Integer local_88;
  Integer local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  Integer *local_58;
  Integer local_50;
  Integer local_48;
  Integer local_40;
  Integer local_38;
  int local_2c;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  
  proc = in_RDI + 1000;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  pnga_pgroup_sync((Integer)in_stack_fffffffffffffcd0);
  if (GA[proc].property != 0) {
    pnga_error(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  }
  iVar2 = strcmp(in_RSI,"read_only");
  if (iVar2 == 0) {
    if (GA[proc].distr_type != 0) {
      pnga_error(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    }
    bytes = (long)GA[proc].p_handle;
    IVar4 = pnga_pgroup_get_world();
    if (bytes != IVar4) {
      pnga_error(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    }
    iVar2 = (int)GA[proc].ndim;
    iVar10 = 0;
    for (iVar11 = 0; iVar11 < iVar2; iVar11 = iVar11 + 1) {
      GA[proc].old_nblock[iVar11] = GA[proc].nblock[iVar11];
      GA[proc].old_lo[iVar11] = (int)GA[proc].lo[iVar11];
      GA[proc].old_chunk[iVar11] = (int)GA[proc].chunk[iVar11];
      iVar10 = GA[proc].nblock[iVar11] + iVar10;
    }
    pIVar5 = (Integer *)malloc((long)(iVar10 + 1) << 3);
    GA[proc].old_mapc = pIVar5;
    for (iVar11 = 0; iVar11 < iVar10 + 1; iVar11 = iVar11 + 1) {
      GA[proc].old_mapc[iVar11] = GA[proc].mapc[iVar11];
    }
    local_88 = pnga_create_handle();
    pnga_set_data((Integer)in_stack_fffffffffffffcf0,(Integer)in_stack_fffffffffffffce8,
                  in_stack_fffffffffffffce0,
                  CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    pnga_set_pgroup((Integer)in_stack_fffffffffffffcd0,
                    CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
    lVar6 = pnga_allocate(dims[2]);
    if (lVar6 == 0) {
      pnga_error(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    }
    pnga_copy(pe[6],pe[5]);
    GA[proc].old_handle = GA[proc].p_handle;
    local_40 = pnga_cluster_nodeid();
    local_38 = pnga_cluster_nprocs(0x1dd12f);
    local_48 = pnga_cluster_procid((Integer)in_stack_fffffffffffffcd0,
                                   CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
    local_50 = pnga_pgroup_get_default();
    pnga_pgroup_get_world();
    pnga_pgroup_set_default((Integer)in_stack_fffffffffffffcd0);
    local_98 = malloc(local_38 << 3);
    for (iVar11 = 0; iVar11 < local_38; iVar11 = iVar11 + 1) {
      *(Integer *)((long)local_98 + (long)iVar11 * 8) = local_48 + iVar11;
    }
    local_58 = (Integer *)
               pnga_pgroup_create(in_stack_fffffffffffffd20,(Integer)in_stack_fffffffffffffd18);
    free(local_98);
    iVar3 = (int)((ulong)in_stack_fffffffffffffd20 >> 0x20);
    GA[proc].p_handle = (int)local_58;
    GA[proc].property = 1;
    for (iVar11 = 0; iVar11 < iVar2; iVar11 = iVar11 + 1) {
      if (GA[proc].chunk[iVar11] == GA[proc].dims[iVar11]) {
        *(C_Integer *)(&stack0xfffffffffffffe68 + (long)iVar11 * 8) = GA[proc].chunk[iVar11];
      }
      else {
        *(undefined8 *)(&stack0xfffffffffffffe68 + (long)iVar11 * 8) = 0xffffffffffffffff;
      }
      local_118[iVar11] = GA[proc].dims[iVar11];
    }
    if (in_stack_fffffffffffffe68 == 0) {
      for (iVar11 = 0; iVar11 < iVar2; iVar11 = iVar11 + 1) {
        local_d8[iVar11] = -1;
      }
    }
    else {
      for (iVar11 = 0; iVar3 = (int)((ulong)in_stack_fffffffffffffd20 >> 0x20), iVar11 < iVar2;
          iVar11 = iVar11 + 1) {
        if (local_118[iVar11] < *(long *)(&stack0xfffffffffffffe68 + (long)iVar11 * 8)) {
          in_stack_fffffffffffffd20 = (Integer *)local_118[iVar11];
        }
        else {
          in_stack_fffffffffffffd20 = *(Integer **)(&stack0xfffffffffffffe68 + (long)iVar11 * 8);
        }
        local_d8[iVar11] = (C_Integer)in_stack_fffffffffffffd20;
      }
    }
    for (iVar11 = 0; iVar11 < iVar2; iVar11 = iVar11 + 1) {
      if (local_118[iVar11] == 1) {
        local_d8[iVar11] = 1;
      }
    }
    ddb_h2(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
           (double)in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
           (Integer *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
    iVar11 = 0;
    pIVar5 = mapALL;
    while( true ) {
      iVar9 = (int)in_stack_fffffffffffffd50;
      iVar12 = (int)((ulong)in_stack_fffffffffffffd10 >> 0x20);
      if (iVar2 <= iVar11) break;
      *(Integer **)(&stack0xfffffffffffffd68 + (long)iVar11 * 8) = pIVar5;
      if (*(long *)(&stack0xfffffffffffffe68 + (long)iVar11 * 8) < 2) {
        lVar7 = local_118[iVar11] - (local_d8[iVar11] + -1) * local_158[iVar11];
      }
      else {
        in_stack_fffffffffffffd18 = (long *)(local_118[iVar11] + -1);
        if (local_118[iVar11] < *(long *)(&stack0xfffffffffffffe68 + (long)iVar11 * 8)) {
          in_stack_fffffffffffffd10 = local_118[iVar11];
        }
        else {
          in_stack_fffffffffffffd10 = *(long *)(&stack0xfffffffffffffe68 + (long)iVar11 * 8);
        }
        in_stack_fffffffffffffd38 =
             (char *)((long)in_stack_fffffffffffffd18 / in_stack_fffffffffffffd10 + 1);
        lVar7 = (long)in_stack_fffffffffffffd38 - (local_d8[iVar11] + -1) * local_158[iVar11];
      }
      iVar9 = 0;
      iVar12 = 0;
      in_stack_fffffffffffffd50 = 0;
      while( true ) {
        bVar1 = false;
        if ((long)iVar9 < local_158[iVar11]) {
          bVar1 = (long)iVar12 < local_118[iVar11];
        }
        if (!bVar1) break;
        in_stack_fffffffffffffd30 = (char **)local_d8[iVar11];
        if (lVar7 <= iVar9) {
          in_stack_fffffffffffffd30 = (char **)((long)in_stack_fffffffffffffd30 + -1);
        }
        pIVar5[in_stack_fffffffffffffd50] = (long)(iVar12 + 1);
        if (1 < *(long *)(&stack0xfffffffffffffe68 + (long)iVar11 * 8)) {
          if (local_118[iVar11] < *(long *)(&stack0xfffffffffffffe68 + (long)iVar11 * 8)) {
            local_300 = local_118[iVar11];
          }
          else {
            local_300 = *(long *)(&stack0xfffffffffffffe68 + (long)iVar11 * 8);
          }
          in_stack_fffffffffffffd30 = (char **)(local_300 * (long)in_stack_fffffffffffffd30);
        }
        iVar12 = iVar12 + (int)in_stack_fffffffffffffd30;
        iVar9 = iVar9 + 1;
        in_stack_fffffffffffffd50 = in_stack_fffffffffffffd50 + 1;
      }
      local_308 = in_stack_fffffffffffffd50;
      if (local_158[iVar11] <= in_stack_fffffffffffffd50) {
        local_308 = local_158[iVar11];
      }
      local_158[iVar11] = local_308;
      pIVar5 = pIVar5 + local_158[iVar11];
      iVar11 = iVar11 + 1;
    }
    local_60 = 0;
    for (iVar13 = 0; iVar13 < iVar2; iVar13 = iVar13 + 1) {
      GA[proc].nblock[iVar13] = (int)local_158[iVar13];
      local_60 = local_158[iVar13] + local_60;
    }
    free(GA[proc].mapc);
    pCVar8 = (C_Integer *)malloc((local_60 + 1) * 8);
    GA[proc].mapc = pCVar8;
    for (iVar13 = 0; iVar13 < local_60; iVar13 = iVar13 + 1) {
      GA[proc].mapc[iVar13] = mapALL[iVar13];
    }
    GA[proc].mapc[local_60] = -1;
    for (iVar13 = 0; iVar13 < iVar2; iVar13 = iVar13 + 1) {
      GA[proc].scale[iVar13] = (double)GA[proc].nblock[iVar13] / (double)GA[proc].dims[iVar13];
    }
    pnga_distribution((Integer)in_RSI,proc,(Integer *)CONCAT44(iVar13,iVar11),
                      (Integer *)CONCAT44(iVar2,iVar10));
    local_2c = 1;
    local_68 = 1;
    for (iVar13 = 0; iVar13 < iVar2; iVar13 = iVar13 + 1) {
      if ((local_218[iVar13] - GA[proc].lo[iVar13]) + 1 < 1) {
        local_2c = 0;
      }
      local_68 = ((local_218[iVar13] - GA[proc].lo[iVar13]) + 1) * local_68;
    }
    local_70 = local_68 * GA[proc].elemsize;
    if (local_2c == 0) {
      local_70 = 0;
    }
    local_80 = pnga_pgroup_nodeid((Integer)local_58);
    if (GA[proc].old_handle < 1) {
      in_stack_fffffffffffffce8 = GA[proc].ptr;
      pnga_pgroup_nodeid((long)GA[proc].old_handle);
      ARMCI_Free((void *)0x1ddd47);
    }
    else {
      in_stack_fffffffffffffcf0 = GA[proc].ptr;
      pnga_pgroup_nodeid((long)GA[proc].old_handle);
      ARMCI_Free_group(in_stack_fffffffffffffcd0,
                       (ARMCI_Group *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8))
      ;
    }
    if (GA_memory_limited != 0) {
      GA_total_memory = GA[proc].size + GA_total_memory;
    }
    if (GA_memory_limited != 0) {
      GA_total_memory = GA_total_memory - local_70;
    }
    GAstat.curmem = local_70 + (GAstat.curmem - GA[proc].size);
    if (GA_memory_limited == 0) {
      local_78 = 1;
    }
    else {
      local_78 = (long)(int)(uint)(-1 < GA_total_memory);
      in_stack_fffffffffffffce0 = local_58;
      pnga_type_f2c(0x3f2);
      pnga_pgroup_gop((Integer)in_stack_fffffffffffffcf0,(Integer)in_stack_fffffffffffffce8,
                      in_stack_fffffffffffffce0,
                      CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                      (char *)in_stack_fffffffffffffcd0);
    }
    if (local_78 == 0) {
      GA[proc].ptr[local_80] = (char *)0x0;
    }
    else {
      if (GA[proc].mem_dev_set == 0) {
        iVar3 = gai_getmem((char *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
                           (C_Long)in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc,
                           in_stack_fffffffffffffcd0,in_stack_fffffffffffffccc);
      }
      else {
        iVar3 = gai_get_devmem(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,bytes,iVar3,
                               in_stack_fffffffffffffd18,iVar12,iVar9,in_stack_fffffffffffffd58);
      }
      local_78 = (long)(int)(uint)((iVar3 != 0 ^ 0xffU) & 1);
    }
    GA[proc].size = local_70;
    if (local_78 == 0) {
      pnga_error(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    }
    pnga_distribution((Integer)in_RSI,proc,(Integer *)CONCAT44(iVar13,iVar11),
                      (Integer *)CONCAT44(iVar2,iVar10));
    local_2c = 1;
    local_68 = 1;
    for (iVar10 = 0; iVar10 < iVar2; iVar10 = iVar10 + 1) {
      local_258[iVar10] = (local_218[iVar10] - local_1d8[iVar10]) + 1;
      local_68 = local_258[iVar10] * local_68;
      if (local_218[iVar10] < local_1d8[iVar10]) {
        local_2c = 0;
      }
    }
    if (local_2c != 0) {
      pnga_get(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
               in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
    }
    pnga_destroy((Integer)in_stack_fffffffffffffce8);
  }
  else {
    iVar2 = strcmp(in_RSI,"read_cache");
    if (iVar2 == 0) {
      GA[proc].property = 2;
      GA[proc].cache_head = (cache_struct_t *)0x0;
    }
    else {
      pnga_error(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    }
  }
  return;
}

Assistant:

void pnga_set_property(Integer g_a, char* property) {
  Integer ga_handle = g_a + GA_OFFSET;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous sync masking*/
  pnga_pgroup_sync(GA[ga_handle].p_handle);
  /* Check to see if property conflicts with properties already set on the
   * global array. This check may need more refinement as additional properties
   * are added. */
  if (GA[ga_handle].property != NO_PROPERTY) {
    pnga_error("Cannot set property on an array that already has property set",0);
  }
  if (strcmp(property,"read_only")==0) {
    /* TODO: copy global array to new configuration */
    int i, d, ndim, btot, chk;
    Integer nprocs, nodeid, origin_id, dflt_grp, handle, maplen;
    Integer nelem, mem_size, status, grp_me, g_tmp, me_local;
    Integer *list;
    Integer blk[MAXDIM], dims[MAXDIM], pe[MAXDIM], chunk[MAXDIM];
    Integer lo[MAXDIM], hi[MAXDIM], ld[MAXDIM];
    Integer *pmap[MAXDIM], *map;
    char *buf;
    if (GA[ga_handle].distr_type != REGULAR) {
      pnga_error("Block-cyclic arrays not supported for READ_ONLY",0);
    }
    if (GA[ga_handle].p_handle != pnga_pgroup_get_world()) {
      pnga_error("Arrays on subgroups not supported for READ_ONLY",0);
    }
    ndim = (int)GA[ga_handle].ndim;
    btot = 0;
    for (i=0; i<ndim; i++) {
      GA[ga_handle].old_nblock[i] = GA[ga_handle].nblock[i];
      GA[ga_handle].old_lo[i] = GA[ga_handle].lo[i];
      GA[ga_handle].old_chunk[i] = GA[ga_handle].chunk[i];
      btot += GA[ga_handle].nblock[i];
    }
    GA[ga_handle].old_mapc = (Integer*)malloc((btot+1)*sizeof(Integer));
    for (i=0; i<btot+1; i++) {
      GA[ga_handle].old_mapc[i] = GA[ga_handle].mapc[i];
    }
    /* Make a temporary copy of GA */
    g_tmp = pnga_create_handle();
    pnga_set_data(g_tmp,ndim,GA[ga_handle].dims,GA[ga_handle].type);
    pnga_set_pgroup(g_tmp,GA[ga_handle].p_handle);
    if (!pnga_allocate(g_tmp)) {
      pnga_error("Failed to allocate temporary array",0);
    }
    pnga_copy(g_a, g_tmp);
    /* Create a group containing all the processors on this node */
    GA[ga_handle].old_handle = GA[ga_handle].p_handle;
    nodeid = pnga_cluster_nodeid();
    nprocs = pnga_cluster_nprocs(nodeid);
    origin_id = pnga_cluster_procid(nodeid,0);
    dflt_grp = pnga_pgroup_get_default();
    pnga_pgroup_set_default(pnga_pgroup_get_world());
    list = (Integer*)malloc(nprocs*sizeof(Integer));
    for (i=0; i<nprocs; i++) {
      list[i] = origin_id+i;
    }
    handle = pnga_pgroup_create(list, nprocs);
    free(list);
    GA[ga_handle].p_handle = handle;
    GA[ga_handle].property = READ_ONLY;

    /* Ignore hints on data distribution (chunk) and just go with default
     * distribution on the node, except if chunk dimension is same as array
     * dimension (no partitioning on that axis) */
    for (i=0; i<ndim; i++) {
      /* eliminate dimension=1 from analysis, otherwise set blk to -1*/
      if (GA[ga_handle].chunk[i] == GA[ga_handle].dims[i]) {
        chunk[i] = GA[ga_handle].chunk[i];
      } else {
        chunk[i] = -1;
      }
      dims[i] = GA[ga_handle].dims[i];
    }
    if (chunk[0] != 0)
      for (d=0; d<ndim; d++) blk[d]=(Integer)GA_MIN(chunk[d],dims[d]);
    else
      for (d=0; d<ndim; d++) blk[d]=-1;
    for (d=0; d<ndim; d++) if (dims[d]==1) blk[d]=1;
    ddb_h2(ndim, dims, PGRP_LIST[handle].map_nproc,0.0,(Integer)0,blk,pe);
    for(d=0, map=mapALL; d< ndim; d++){
      Integer nblock;
      Integer pcut; /* # procs that get full blk[] elements; the rest gets less*/
      int p;

      pmap[d] = map;

      /* RJH ... don't leave some nodes without data if possible
       * but respect the users block size */

      if (chunk[d] > 1) {
        Integer ddim = ((dims[d]-1)/GA_MIN(chunk[d],dims[d]) + 1);
        pcut = (ddim -(blk[d]-1)*pe[d]) ;
      } else {
        pcut = (dims[d]-(blk[d]-1)*pe[d]) ;
      }

      for (nblock=i=p=0; (p<pe[d]) && (i<dims[d]); p++, nblock++) {
        Integer b = blk[d];
        if (p >= pcut)
          b = b-1;
        map[nblock] = i+1;
        if (chunk[d]>1) b *= GA_MIN(chunk[d],dims[d]);
        i += b;
      }

      pe[d] = GA_MIN(pe[d],nblock);
      map +=  pe[d];
    }
    maplen = 0;
    for( i = 0; i< ndim; i++){
      GA[ga_handle].nblock[i] = pe[i];
      maplen += pe[i];
    }
    free(GA[ga_handle].mapc);
    GA[ga_handle].mapc = (Integer*)malloc((maplen+1)*sizeof(Integer));
    for(i = 0; i< maplen; i++) {
      GA[ga_handle].mapc[i] = (C_Integer)mapALL[i];
    }
    GA[ga_handle].mapc[maplen] = -1;
    /* Set remaining paramters and determine memory size if regular data
     * distribution is being used */

    for( i = 0; i< ndim; i++){
      GA[ga_handle].scale[i] = (double)GA[ga_handle].nblock[i]
        / (double)GA[ga_handle].dims[i];
    }

    /*** determine which portion of the array I am supposed
     * to hold ***/
    pnga_distribution(g_a, GAme, GA[ga_handle].lo, hi);
    chk = 1;
    for( i = 0, nelem=1; i< ndim; i++){
      if (hi[i]-(Integer)GA[ga_handle].lo[i]+1 <= 0) chk = 0;
      nelem *= (hi[i]-(Integer)GA[ga_handle].lo[i]+1);
    }
    mem_size = nelem * GA[ga_handle].elemsize;
    if (!chk) mem_size = 0;
    grp_me = pnga_pgroup_nodeid(handle);
    /* Clean up old memory first */
#ifndef AVOID_MA_STORAGE
    if(gai_uses_shm((int)handle)){
#endif
      /* make sure that we free original (before address allignment)
       * pointer */
#ifdef MSG_COMMS_MPI
      if (GA[ga_handle].old_handle > 0){
        ARMCI_Free_group(
            GA[ga_handle].ptr[pnga_pgroup_nodeid(GA[ga_handle].old_handle)]
            - GA[ga_handle].id,
            &PGRP_LIST[GA[ga_handle].old_handle].group);
      }
      else
#endif
      {
        ARMCI_Free(
            GA[ga_handle].ptr[pnga_pgroup_nodeid(GA[ga_handle].old_handle)]
            - GA[ga_handle].id);
      }
#ifndef AVOID_MA_STORAGE
    }else{
      if(GA[ga_handle].id != INVALID_MA_HANDLE) MA_free_heap(GA[ga_handle].id);
    }
#endif

    if(GA_memory_limited) GA_total_memory += GA[ga_handle].size;
    GAstat.curmem -= GA[ga_handle].size;
    /* if requested, enforce limits on memory consumption */
    if(GA_memory_limited) GA_total_memory -= mem_size;
    GAstat.curmem += mem_size;
    /* check if everybody has enough memory left */
    if(GA_memory_limited){
      status = (GA_total_memory >= 0) ? 1 : 0;
      pnga_pgroup_gop(handle,pnga_type_f2c(MT_F_INT), &status, 1, "&&");
    } else status = 1;
    /* allocate memory */
    if (status) {
      /* Allocate new memory */
      if (GA[ga_handle].mem_dev_set) {
        status = !gai_get_devmem(GA[ga_handle].name, GA[ga_handle].ptr,mem_size,
            GA[ga_handle].type, &GA[ga_handle].id, handle,
            GA[ga_handle].mem_dev_set,GA[ga_handle].mem_dev);
      } else {
        status = !gai_getmem(GA[ga_handle].name, GA[ga_handle].ptr,mem_size,
            GA[ga_handle].type, &GA[ga_handle].id, handle);
      }
    } else {
      GA[ga_handle].ptr[grp_me]=NULL;
    }
    GA[ga_handle].size = (C_Long)mem_size;
    if (!status) {
      pnga_error("Memory failure when unsetting READ_ONLY",0);
    }
    /* Copy data from copy of old GA to new GA and then get rid of copy*/
    pnga_distribution(g_a,GAme,lo,hi);
    chk = 1;
    nelem = 1;
    for (i=0; i<ndim; i++) {
      /*
      GA[ga_handle].chunk[i] = ((C_Integer)hi[i]-GA[ga_handle].lo[i]+1);
      */
      ld[i] = hi[i] - lo[i] + 1;
      nelem *= ld[i];
      if (hi[i] < lo[i]) chk = 0;
    }
    if (chk) {
#if 1
      pnga_get(g_tmp,lo,hi,GA[ga_handle].ptr[grp_me],ld);
#else
      /* MPI RMA does not allow you to use memory assigned to one window as
       * local buffer for another buffer. Create a local buffer to get around
       * this problem */
      buf = (char*)malloc(nelem*GA[ga_handle].elemsize);
      pnga_get(g_tmp,lo,hi,buf,ld);
      memcpy(GA[ga_handle].ptr[grp_me],buf,nelem*GA[ga_handle].elemsize);
      free(buf);
#endif
    }
    pnga_destroy(g_tmp);
  } else if (strcmp(property, "read_cache") == 0) {
    GA[ga_handle].property = READ_CACHE;
    GA[ga_handle].cache_head = NULL; /* (cache_struct_t *)malloc(sizeof(cache_struct_t)) */
  } else {
    pnga_error("Trying to set unknown property",0);
  }
}